

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_transpose_TX_16X16(uint16_t *src,ptrdiff_t pitchSrc,uint16_t *dst,ptrdiff_t pitchDst)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  long in_RCX;
  long lVar5;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int j_1;
  int j;
  __m256i d [16];
  __m256i r [16];
  int local_4a8;
  int local_4a4;
  undefined8 local_4a0 [89];
  __m256i *in_stack_fffffffffffffe28;
  __m256i *in_stack_fffffffffffffe30;
  
  for (local_4a4 = 0; local_4a4 < 0x10; local_4a4 = local_4a4 + 1) {
    puVar4 = (undefined8 *)(in_RDI + local_4a4 * in_RSI * 2);
    uVar1 = puVar4[1];
    uVar2 = puVar4[2];
    uVar3 = puVar4[3];
    lVar5 = (long)local_4a4;
    local_4a0[lVar5 * 4 + 0x40] = *puVar4;
    local_4a0[lVar5 * 4 + 0x41] = uVar1;
    local_4a0[lVar5 * 4 + 0x42] = uVar2;
    local_4a0[lVar5 * 4 + 0x43] = uVar3;
  }
  highbd_transpose16x16_avx2(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  for (local_4a8 = 0; local_4a8 < 0x10; local_4a8 = local_4a8 + 1) {
    puVar4 = (undefined8 *)(in_RDX + local_4a8 * in_RCX * 2);
    lVar5 = (long)local_4a8;
    uVar1 = local_4a0[lVar5 * 4 + 1];
    uVar2 = local_4a0[lVar5 * 4 + 2];
    uVar3 = local_4a0[lVar5 * 4 + 3];
    *puVar4 = local_4a0[lVar5 * 4];
    puVar4[1] = uVar1;
    puVar4[2] = uVar2;
    puVar4[3] = uVar3;
  }
  return;
}

Assistant:

static void highbd_transpose_TX_16X16(const uint16_t *src, ptrdiff_t pitchSrc,
                                      uint16_t *dst, ptrdiff_t pitchDst) {
  __m256i r[16];
  __m256i d[16];
  for (int j = 0; j < 16; j++) {
    r[j] = _mm256_loadu_si256((__m256i *)(src + j * pitchSrc));
  }
  highbd_transpose16x16_avx2(r, d);
  for (int j = 0; j < 16; j++) {
    _mm256_storeu_si256((__m256i *)(dst + j * pitchDst), d[j]);
  }
}